

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O2

word Extra_TruthCanonNPN3(word uTruth,int nVars,Vec_Wrd_t *vRes)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  int *__ptr;
  int *__ptr_00;
  ulong uVar4;
  word *pwVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  word wVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  uVar14 = 1 << ((byte)nVars & 0x1f);
  uVar12 = (ulong)uVar14;
  uVar3 = Extra_Factorial(nVars);
  __ptr = Extra_GreyCodeSchedule(nVars);
  __ptr_00 = Extra_PermSchedule(nVars);
  vRes->nSize = 0;
  uVar11 = 0;
  if ((int)uVar14 < 1) {
    uVar12 = 0;
  }
  uVar16 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar16 = 0;
  }
  wVar10 = 0xffffffffffffffff;
  lVar7 = 0;
  do {
    if (lVar7 == 2) {
      free(__ptr);
      free(__ptr_00);
      return wVar10;
    }
    uVar17 = -lVar7;
    uVar18 = uVar17 ^ uTruth;
    for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
      uVar6 = uVar18;
      for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
        if (uVar6 <= wVar10) {
          wVar10 = uVar6;
        }
        uVar4 = 0;
        if (0 < (int)uVar11) {
          uVar4 = (ulong)uVar11;
        }
        uVar8 = 0;
        do {
          if (uVar4 == uVar8) {
            if (uVar11 == vRes->nCap) {
              uVar3 = uVar11 * 2;
              if ((int)uVar11 < 0x10) {
                uVar3 = 0x10;
              }
              pwVar5 = vRes->pArray;
              if ((int)uVar11 < (int)uVar3) {
                if (pwVar5 == (word *)0x0) {
                  pwVar5 = (word *)malloc((ulong)uVar3 << 3);
                }
                else {
                  pwVar5 = (word *)realloc(pwVar5,(ulong)uVar3 << 3);
                }
                vRes->pArray = pwVar5;
                if (pwVar5 == (word *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                                ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
                }
                vRes->nCap = uVar3;
                uVar11 = vRes->nSize;
              }
            }
            else {
              pwVar5 = vRes->pArray;
            }
            lVar9 = (long)(int)uVar11;
            uVar11 = uVar11 + 1;
            vRes->nSize = uVar11;
            pwVar5[lVar9] = uVar6;
            break;
          }
          pwVar5 = vRes->pArray + uVar8;
          uVar8 = uVar8 + 1;
        } while (*pwVar5 != uVar6);
        bVar2 = (byte)(1L << ((byte)__ptr[uVar13] & 0x3f));
        uVar6 = (s_Truths6[__ptr[uVar13]] & uVar6) >> (bVar2 & 0x3f) |
                uVar6 << (bVar2 & 0x3f) & s_Truths6[__ptr[uVar13]];
      }
      if (uVar18 != uVar6) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecMult.c"
                      ,0xb9,"word Extra_TruthCanonNPN3(word, int, Vec_Wrd_t *)");
      }
      iVar1 = __ptr_00[uVar15];
      bVar2 = (byte)(1L << ((byte)iVar1 & 0x3f));
      uVar18 = (uVar18 & s_PMasks[iVar1][2]) >> (bVar2 & 0x3f) |
               (s_PMasks[iVar1][1] & uVar18) << (bVar2 & 0x3f) | s_PMasks[iVar1][0] & uVar18;
    }
    lVar7 = lVar7 + 1;
    if ((uVar17 ^ uTruth) != uVar18) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecMult.c"
                    ,0xbc,"word Extra_TruthCanonNPN3(word, int, Vec_Wrd_t *)");
    }
  } while( true );
}

Assistant:

word Extra_TruthCanonNPN3( word uTruth, int nVars, Vec_Wrd_t * vRes )
{
    int nMints  = (1 << nVars);
    int nPerms  = Extra_Factorial( nVars );
    int * pComp = Extra_GreyCodeSchedule( nVars );
    int * pPerm = Extra_PermSchedule( nVars );
    word tCur, tTemp1, tTemp2;
    word uTruthMin = ABC_CONST(0xFFFFFFFFFFFFFFFF);
    int i, p, c;
    Vec_WrdClear( vRes );
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                if ( uTruthMin > tCur )
                    uTruthMin = tCur;
                Vec_WrdPushUnique( vRes, tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    ABC_FREE( pComp );
    ABC_FREE( pPerm );
    return uTruthMin;
}